

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

int Saig_TsiComputePrefix(Saig_Tsim_t *p,uint *pState,int nWords)

{
  uint *__s1;
  int iVar1;
  uint **ppuVar2;
  uint *puVar3;
  
  iVar1 = Saig_TsiStateHash(pState,nWords,p->nBins);
  ppuVar2 = p->pBins + iVar1;
  while( true ) {
    __s1 = *ppuVar2;
    if (__s1 == (uint *)0x0) {
      return -1;
    }
    iVar1 = bcmp(__s1,pState,(long)nWords * 4);
    if (iVar1 == 0) break;
    ppuVar2 = (uint **)(__s1 + nWords);
  }
  iVar1 = 0;
  while( true ) {
    if (p->vStates->nSize <= iVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x17a,"int Saig_TsiComputePrefix(Saig_Tsim_t *, unsigned int *, int)");
    }
    puVar3 = (uint *)Vec_PtrEntry(p->vStates,iVar1);
    if (puVar3 == __s1) break;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int Saig_TsiComputePrefix( Saig_Tsim_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry, * pPrev;
    int Hash, i;
    Hash = Saig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Saig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
        {
            Vec_PtrForEachEntry( unsigned *, p->vStates, pPrev, i )
            {
                if ( pPrev == pEntry )
                    return i;
            }
            assert( 0 );
            return -1;
        }
    return -1;
}